

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pillar.cpp
# Opt level: O3

void __thiscall
DPillar::DPillar(DPillar *this,sector_t *sector,EPillar type,double speed,double floordist,
                double ceilingdist,int crush,bool hexencrush)

{
  DInterpolation *pDVar1;
  double dVar2;
  undefined8 in_XMM1_Qb;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  vertex_t *spot;
  vertex_t *local_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  FName local_3c;
  double local_38;
  
  local_68 = floordist;
  uStack_60 = in_XMM1_Qb;
  local_58 = ceilingdist;
  local_38 = speed;
  DMover::DMover(&this->super_DMover,sector);
  (this->super_DMover).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_00872448;
  (sector->ceilingdata).field_0.p = (DSectorEffect *)this;
  (sector->floordata).field_0.p = (DSectorEffect *)this;
  pDVar1 = sector_t::SetInterpolation(sector,1,true);
  (this->m_Interp_Floor).field_0.p = pDVar1;
  pDVar1 = sector_t::SetInterpolation(sector,0,true);
  (this->m_Interp_Ceiling).field_0.p = pDVar1;
  this->m_Type = type;
  this->m_Crush = crush;
  this->m_Hexencrush = hexencrush;
  if (type == pillarBuild) {
    dVar4 = (sector->centerspot).X;
    dVar5 = (sector->centerspot).Y;
    dVar3 = (sector->floorplane).normal.X * dVar4;
    dVar6 = dVar5 * (sector->floorplane).normal.Y;
    dVar2 = ((sector->floorplane).D + dVar3 + dVar6) * (sector->floorplane).negiC;
    if ((local_68 != 0.0) || (NAN(local_68))) {
      dVar7 = dVar2 + local_68;
      dVar4 = dVar4 * (sector->ceilingplane).normal.X;
      dVar5 = dVar5 * (sector->ceilingplane).normal.Y;
      dVar3 = dVar7 * (sector->floorplane).normal.Z + dVar6 + dVar3;
      dVar6 = dVar7 * (sector->ceilingplane).normal.Z + dVar5 + dVar4;
      dVar8 = (dVar5 + (sector->ceilingplane).D + dVar4) * (sector->ceilingplane).negiC;
    }
    else {
      dVar4 = dVar4 * (sector->ceilingplane).normal.X;
      dVar5 = dVar5 * (sector->ceilingplane).normal.Y;
      dVar8 = (dVar5 + (sector->ceilingplane).D + dVar4) * (sector->ceilingplane).negiC;
      dVar7 = (dVar2 + dVar8) * 0.5;
      dVar3 = dVar3 + dVar6 + (sector->floorplane).normal.Z * dVar7;
      dVar6 = (sector->ceilingplane).normal.Z * dVar7 + dVar4 + dVar5;
      local_68 = dVar7 - dVar2;
      uStack_60 = 0;
    }
    dVar8 = dVar8 - dVar7;
    this->m_FloorTarget = -dVar3;
    this->m_CeilingTarget = -dVar6;
  }
  else {
    if ((local_68 != 0.0) || (NAN(local_68))) {
      dVar4 = (sector->centerspot).X * (sector->floorplane).normal.X;
      dVar5 = (sector->centerspot).Y * (sector->floorplane).normal.Y;
      this->m_FloorTarget =
           -((((sector->floorplane).D + dVar4 + dVar5) * (sector->floorplane).negiC - local_68) *
             (sector->floorplane).normal.Z + dVar5 + dVar4);
    }
    else {
      local_68 = sector_t::FindLowestFloorSurrounding(sector,&local_70);
      dVar4 = (local_70->p).X * (sector->floorplane).normal.X;
      dVar5 = (local_70->p).Y * (sector->floorplane).normal.Y;
      this->m_FloorTarget = -((sector->floorplane).normal.Z * local_68 + dVar4 + dVar5);
      local_68 = ((sector->floorplane).D + dVar4 + dVar5) * (sector->floorplane).negiC - local_68;
      uStack_60 = 0;
    }
    if ((local_58 != 0.0) || (NAN(local_58))) {
      dVar4 = (sector->centerspot).X * (sector->ceilingplane).normal.X;
      dVar5 = (sector->centerspot).Y * (sector->ceilingplane).normal.Y;
      this->m_CeilingTarget =
           -((((sector->ceilingplane).D + dVar4 + dVar5) * (sector->ceilingplane).negiC + local_58)
             * (sector->ceilingplane).normal.Z + dVar5 + dVar4);
      dVar8 = local_58;
    }
    else {
      dVar4 = sector_t::FindHighestCeilingSurrounding(sector,&local_70);
      dVar5 = (local_70->p).X * (sector->ceilingplane).normal.X;
      dVar3 = (local_70->p).Y * (sector->ceilingplane).normal.Y;
      this->m_CeilingTarget = -((sector->ceilingplane).normal.Z * dVar4 + dVar5 + dVar3);
      dVar8 = dVar4 - ((sector->ceilingplane).D + dVar5 + dVar3) * (sector->ceilingplane).negiC;
    }
  }
  dVar4 = local_38;
  if (dVar8 < local_68) {
    dVar4 = (dVar8 * local_38) / local_68;
  }
  this->m_FloorSpeed =
       (double)(-(ulong)(dVar8 < local_68) & (ulong)local_38 |
               ~-(ulong)(dVar8 < local_68) & (ulong)((local_68 * local_38) / dVar8));
  this->m_CeilingSpeed = dVar4;
  if ((((this->super_DMover).super_DSectorEffect.m_Sector)->Flags & 0x40) == 0) {
    if (sector->seqType < 0) {
      local_3c.Index = (sector->SeqName).super_FName.Index;
      if (local_3c.Index == 0) {
        SN_StartSequence(sector,1,"Floor",0);
      }
      else {
        SN_StartSequence(sector,1,&local_3c,0);
      }
    }
    else {
      SN_StartSequence(sector,1,(int)sector->seqType,SEQ_PLATFORM,0,false);
    }
  }
  return;
}

Assistant:

DPillar::DPillar (sector_t *sector, EPillar type, double speed,
				  double floordist, double ceilingdist, int crush, bool hexencrush)
	: DMover (sector)
{
	double newheight;
	vertex_t *spot;

	sector->floordata = sector->ceilingdata = this;
	m_Interp_Floor = sector->SetInterpolation(sector_t::FloorMove, true);
	m_Interp_Ceiling = sector->SetInterpolation(sector_t::CeilingMove, true);

	m_Type = type;
	m_Crush = crush;
	m_Hexencrush = hexencrush;

	if (type == pillarBuild)
	{
		// If the pillar height is 0, have the floor and ceiling meet halfway
		if (floordist == 0)
		{
			newheight = (sector->CenterFloor () + sector->CenterCeiling ()) / 2;
			m_FloorTarget = sector->floorplane.PointToDist (sector->centerspot, newheight);
			m_CeilingTarget = sector->ceilingplane.PointToDist (sector->centerspot, newheight);
			floordist = newheight - sector->CenterFloor ();
		}
		else
		{
			newheight = sector->CenterFloor () + floordist;
			m_FloorTarget = sector->floorplane.PointToDist (sector->centerspot, newheight);
			m_CeilingTarget = sector->ceilingplane.PointToDist (sector->centerspot, newheight);
		}
		ceilingdist = sector->CenterCeiling () - newheight;
	}
	else
	{
		// If one of the heights is 0, figure it out based on the
		// surrounding sectors
		if (floordist == 0)
		{
			newheight = sector->FindLowestFloorSurrounding (&spot);
			m_FloorTarget = sector->floorplane.PointToDist (spot, newheight);
			floordist = sector->floorplane.ZatPoint (spot) - newheight;
		}
		else
		{
			newheight = sector->CenterFloor() - floordist;
			m_FloorTarget = sector->floorplane.PointToDist (sector->centerspot, newheight);
		}
		if (ceilingdist == 0)
		{
			newheight = sector->FindHighestCeilingSurrounding (&spot);
			m_CeilingTarget = sector->ceilingplane.PointToDist (spot, newheight);
			ceilingdist = newheight - sector->ceilingplane.ZatPoint (spot);
		}
		else
		{
			newheight = sector->CenterCeiling() + ceilingdist;
			m_CeilingTarget = sector->ceilingplane.PointToDist (sector->centerspot, newheight);
		}
	}

	// The speed parameter applies to whichever part of the pillar
	// travels the farthest. The other part's speed is then set so
	// that it arrives at its destination at the same time.
	if (floordist > ceilingdist)
	{
		m_FloorSpeed = speed;
		m_CeilingSpeed = speed * ceilingdist / floordist;
	}
	else
	{
		m_CeilingSpeed = speed;
		m_FloorSpeed = speed * floordist / ceilingdist;
	}

	if (!(m_Sector->Flags & SECF_SILENTMOVE))
	{
		if (sector->seqType >= 0)
		{
			SN_StartSequence(sector, CHAN_FLOOR, sector->seqType, SEQ_PLATFORM, 0);
		}
		else if (sector->SeqName != NAME_None)
		{
			SN_StartSequence(sector, CHAN_FLOOR, sector->SeqName, 0);
		}
		else
		{
			SN_StartSequence(sector, CHAN_FLOOR, "Floor", 0);
		}
	}
}